

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_byte_array_decoder.cpp
# Opt level: O1

void __thiscall duckdb::DeltaByteArrayDecoder::InitializePage(DeltaByteArrayDecoder *this)

{
  uint64_t *puVar1;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  uint uVar2;
  int iVar3;
  ColumnReader *pCVar4;
  Allocator *allocator;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var7;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var8;
  type buffer;
  Vector *pVVar9;
  type pVVar10;
  ulong uVar11;
  runtime_error *this_01;
  idx_t len;
  char *__dest;
  data_ptr_t __src;
  anon_union_16_2_67f50693_for_value *paVar12;
  long lVar13;
  anon_struct_16_3_d7536bce_for_pointer aVar14;
  idx_t prefix_count;
  idx_t suffix_count;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_70;
  LogicalType local_68;
  long local_50;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *local_48;
  idx_t local_40;
  idx_t local_38;
  
  if ((this->reader->column_schema->type).physical_type_ == VARCHAR) {
    buffer = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(&this->reader->block);
    pCVar4 = this->reader;
    allocator = pCVar4->reader->allocator;
    ReadDbpData(allocator,buffer,pCVar4->encoding_buffers,&local_40);
    ReadDbpData(allocator,buffer,pCVar4->encoding_buffers + 1,&local_38);
    if (local_40 == local_38) {
      if (local_40 == 0) {
        pVVar9 = (Vector *)operator_new(0x68);
        LogicalType::LogicalType(&local_68,VARCHAR);
        Vector::Vector(pVVar9,&local_68,(data_ptr_t)0x0);
        local_70._M_head_impl = pVVar9;
        LogicalType::~LogicalType(&local_68);
        _Var8._M_head_impl = local_70._M_head_impl;
        local_70._M_head_impl = (Vector *)0x0;
        _Var7._M_head_impl =
             (this->byte_array_data).
             super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
             super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
             super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
        (this->byte_array_data).
        super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = _Var8._M_head_impl;
        if (_Var7._M_head_impl != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&this->byte_array_data,_Var7._M_head_impl);
        }
        if (local_70._M_head_impl != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&local_70,local_70._M_head_impl);
        }
      }
      else {
        pdVar5 = pCVar4->encoding_buffers[0].super_ByteBuffer.ptr;
        pdVar6 = pCVar4->encoding_buffers[1].super_ByteBuffer.ptr;
        pVVar9 = (Vector *)operator_new(0x68);
        LogicalType::LogicalType(&local_68,VARCHAR);
        Vector::Vector(pVVar9,&local_68,local_40);
        local_70._M_head_impl = pVVar9;
        LogicalType::~LogicalType(&local_68);
        _Var8._M_head_impl = local_70._M_head_impl;
        this_00 = &this->byte_array_data;
        local_70._M_head_impl = (Vector *)0x0;
        _Var7._M_head_impl =
             (this->byte_array_data).
             super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
             super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
             super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
        (this->byte_array_data).
        super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = _Var8._M_head_impl;
        if (_Var7._M_head_impl != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)this_00,_Var7._M_head_impl);
        }
        if (local_70._M_head_impl != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&local_70,local_70._M_head_impl);
        }
        this->byte_array_count = local_40;
        this->delta_offset = 0;
        local_48 = this_00;
        pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (this_00);
        paVar12 = (anon_union_16_2_67f50693_for_value *)pVVar10->data;
        local_50 = local_40 + (local_40 == 0);
        lVar13 = 0;
        do {
          uVar2 = *(uint *)(pdVar6 + lVar13 * 4);
          iVar3 = *(int *)(pdVar5 + lVar13 * 4);
          ByteBuffer::available(&buffer->super_ByteBuffer,(ulong)uVar2);
          pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (local_48);
          aVar14 = (anon_struct_16_3_d7536bce_for_pointer)
                   StringVector::EmptyString
                             ((StringVector *)pVVar10,(Vector *)(ulong)(iVar3 + uVar2),len);
          __dest = aVar14.ptr;
          paVar12->pointer = aVar14;
          if (aVar14.length < 0xd) {
            __dest = (paVar12->pointer).prefix;
          }
          uVar2 = *(uint *)(pdVar5 + lVar13 * 4);
          if ((ulong)uVar2 != 0) {
            if ((lVar13 == 0) || (paVar12[-1].pointer.length < uVar2)) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error
                        (this_01,"DELTA_BYTE_ARRAY - prefix is out of range - corrupt file?");
              goto LAB_01c3eae7;
            }
            if (paVar12[-1].pointer.length < 0xd) {
              __src = (data_ptr_t)((long)paVar12 + -0xc);
            }
            else {
              __src = *(data_ptr_t *)((long)paVar12 + -8);
            }
            switchD_01602a8a::default(__dest,__src,(ulong)uVar2);
          }
          switchD_01602a8a::default
                    (__dest + *(uint *)(pdVar5 + lVar13 * 4),(buffer->super_ByteBuffer).ptr,
                     (ulong)*(uint *)(pdVar6 + lVar13 * 4));
          uVar11 = (ulong)*(uint *)(pdVar6 + lVar13 * 4);
          ByteBuffer::available(&buffer->super_ByteBuffer,uVar11);
          puVar1 = &(buffer->super_ByteBuffer).len;
          *puVar1 = *puVar1 - uVar11;
          (buffer->super_ByteBuffer).ptr = (buffer->super_ByteBuffer).ptr + uVar11;
          uVar11 = (ulong)(paVar12->pointer).length;
          if (uVar11 < 0xd) {
            switchD_0105dc25::default((data_ptr_t)((long)paVar12 + uVar11 + 4),0,0xc - uVar11);
          }
          else {
            *(undefined4 *)(paVar12->pointer).prefix = *(undefined4 *)(paVar12->pointer).ptr;
          }
          lVar13 = lVar13 + 1;
          paVar12 = paVar12 + 1;
        } while (local_50 != lVar13);
      }
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_01,"DELTA_BYTE_ARRAY - prefix and suffix counts are different - corrupt file?");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_01,"Delta Byte Array encoding is only supported for string/blob data");
  }
LAB_01c3eae7:
  __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DeltaByteArrayDecoder::InitializePage() {
	if (reader.Type().InternalType() != PhysicalType::VARCHAR) {
		throw std::runtime_error("Delta Byte Array encoding is only supported for string/blob data");
	}
	auto &block = *reader.block;
	auto &allocator = reader.reader.allocator;
	idx_t prefix_count, suffix_count;
	auto &prefix_buffer = reader.encoding_buffers[0];
	auto &suffix_buffer = reader.encoding_buffers[1];
	ReadDbpData(allocator, block, prefix_buffer, prefix_count);
	ReadDbpData(allocator, block, suffix_buffer, suffix_count);
	if (prefix_count != suffix_count) {
		throw std::runtime_error("DELTA_BYTE_ARRAY - prefix and suffix counts are different - corrupt file?");
	}
	if (prefix_count == 0) {
		// no values
		byte_array_data = make_uniq<Vector>(LogicalType::VARCHAR, nullptr);
		return;
	}
	auto prefix_data = reinterpret_cast<uint32_t *>(prefix_buffer.ptr);
	auto suffix_data = reinterpret_cast<uint32_t *>(suffix_buffer.ptr);
	byte_array_data = make_uniq<Vector>(LogicalType::VARCHAR, prefix_count);
	byte_array_count = prefix_count;
	delta_offset = 0;
	auto string_data = FlatVector::GetData<string_t>(*byte_array_data);
	for (idx_t i = 0; i < prefix_count; i++) {
		auto str_len = prefix_data[i] + suffix_data[i];
		block.available(suffix_data[i]);
		string_data[i] = StringVector::EmptyString(*byte_array_data, str_len);
		auto result_data = string_data[i].GetDataWriteable();
		if (prefix_data[i] > 0) {
			if (i == 0 || prefix_data[i] > string_data[i - 1].GetSize()) {
				throw std::runtime_error("DELTA_BYTE_ARRAY - prefix is out of range - corrupt file?");
			}
			memcpy(result_data, string_data[i - 1].GetData(), prefix_data[i]);
		}
		memcpy(result_data + prefix_data[i], block.ptr, suffix_data[i]);
		block.inc(suffix_data[i]);
		string_data[i].Finalize();
	}
}